

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::BinaryLogLoss::forward_impl
          (BinaryLogLoss *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs
          ,Tensor *fx)

{
  float fVar1;
  Tensor *pTVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Tensor x;
  Tensor y;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  ulong uStack_b0;
  undefined8 local_a8;
  float *pfStack_a0;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_98;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  float *pfStack_50;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> local_48;
  
  pTVar2 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_c8 = *(undefined8 *)(pTVar2->d).d;
  uStack_c0 = *(undefined8 *)((pTVar2->d).d + 2);
  local_b8 = *(undefined8 *)((pTVar2->d).d + 4);
  uStack_b0 = *(ulong *)((pTVar2->d).d + 6);
  local_a8 = *(undefined8 *)&(pTVar2->d).bd;
  pfStack_a0 = pTVar2->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_98,&pTVar2->bs);
  pTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start[1];
  local_78 = *(undefined8 *)(pTVar2->d).d;
  uStack_70 = *(undefined8 *)((pTVar2->d).d + 2);
  local_68 = *(undefined8 *)((pTVar2->d).d + 4);
  uStack_60 = *(undefined8 *)((pTVar2->d).d + 6);
  local_58 = *(undefined8 *)&(pTVar2->d).bd;
  pfStack_50 = pTVar2->v;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&local_48,&pTVar2->bs);
  iVar4 = 1;
  if (uStack_b0 >> 0x20 != 0) {
    uVar3 = 0;
    do {
      iVar4 = iVar4 * *(int *)((long)&local_c8 + uVar3 * 4);
      uVar3 = uVar3 + 1;
    } while (uStack_b0 >> 0x20 != uVar3);
  }
  uVar5 = iVar4 * (int)local_a8;
  if (uVar5 == 0) {
    fVar7 = 0.0;
  }
  else {
    uVar3 = 0;
    fVar7 = 0.0;
    do {
      fVar6 = pfStack_a0[uVar3];
      fVar1 = pfStack_50[uVar3];
      if ((fVar1 != 1.0) || (NAN(fVar1))) {
        if ((fVar1 != 0.0) || (NAN(fVar1))) {
          if ((((fVar6 != 0.0) || (fVar8 = 1.1754944e-38, NAN(fVar6))) &&
              (fVar8 = fVar6, fVar6 == 1.0)) && (!NAN(fVar6))) {
            fVar8 = 1.1754944e-38;
          }
          fVar6 = logf(fVar8);
          fVar8 = log1pf(-fVar8);
          fVar6 = fVar6 * fVar1 + fVar8 * (1.0 - fVar1);
          goto LAB_001abced;
        }
        fVar6 = log1pf((float)(~-(uint)(fVar6 == 1.0) & (uint)-fVar6 |
                              -(uint)(fVar6 == 1.0) & 0x80800000));
        fVar6 = fVar6 * (fVar1 + -1.0);
      }
      else {
        fVar6 = logf((float)(~-(uint)(fVar6 == 0.0) & (uint)fVar6 | -(uint)(fVar6 == 0.0) & 0x800000
                            ));
LAB_001abced:
        fVar6 = -fVar6;
      }
      fVar7 = fVar7 + fVar6;
      uVar3 = uVar3 + 1;
    } while (uVar5 != uVar3);
  }
  *fx->v = fVar7;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_48);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector(&local_98);
  return;
}

Assistant:

void BinaryLogLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("BinaryLogLoss not yet implemented for CUDA");
#else
  auto x = *xs[0];
  auto y = *xs[1];
  FBinaryLogLoss bll;
  const size_t s = x.d.size();
  float dist = 0;
  for (size_t i = 0; i < s; ++i)
    dist += bll(x.v[i], y.v[i]);
  fx.v[0] = dist;
#endif
}